

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void Assimp::BlenderImporter::CheckActualType(ElemBase *dt,char *check)

{
  int iVar1;
  ostream *poVar2;
  char *local_1b0;
  string local_1a8;
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_1b0 = check;
  if (dt != (ElemBase *)0x0) {
    iVar1 = strcmp(dt->dna_type,check);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"Expected object at ",0x13);
      *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
           *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188," to be of type `",0x10);
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_188,&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"`, but it claims to be a `",0x1a);
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar2
                         ,&dt->dna_type);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"`instead",8);
      std::__cxx11::stringbuf::str();
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
      std::ios_base::~ios_base(local_118);
    }
    return;
  }
  __assert_fail("dt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Blender/BlenderLoader.cpp"
                ,0x30a,
                "static void Assimp::BlenderImporter::CheckActualType(const ElemBase *, const char *)"
               );
}

Assistant:

void BlenderImporter::CheckActualType(const ElemBase* dt, const char* check)
{
    ai_assert(dt);
    if (strcmp(dt->dna_type,check)) {
        ThrowException((format(),
            "Expected object at ",std::hex,dt," to be of type `",check,
            "`, but it claims to be a `",dt->dna_type,"`instead"
        ));
    }
}